

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecProgramCommand.h
# Opt level: O0

cmCommand * __thiscall cmExecProgramCommand::Clone(cmExecProgramCommand *this)

{
  cmCommand *this_00;
  cmExecProgramCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x50);
  cmExecProgramCommand((cmExecProgramCommand *)this_00);
  return this_00;
}

Assistant:

virtual cmCommand* Clone()
    {
    return new cmExecProgramCommand;
    }